

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O3

void Macro_smpsHeaderDAC(uint arg_count,long *arg_array)

{
  uchar byte;
  
  if (arg_count != 0) {
    CheckedChannelPointer((uint)*arg_array);
    if (arg_count == 1) {
      byte = '\0';
      MemoryStream_WriteByte(output_stream,'\0');
    }
    else {
      MemoryStream_WriteByte(output_stream,(uchar)arg_array[1]);
      if (arg_count < 3) {
        byte = '\0';
      }
      else {
        byte = (uchar)arg_array[2];
      }
    }
    MemoryStream_WriteByte(output_stream,byte);
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x1c0,"void Macro_smpsHeaderDAC(unsigned int, long *)");
}

Assistant:

static void Macro_smpsHeaderDAC(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	CheckedChannelPointer(arg_array[0]);		// Location
	WriteByte((arg_count >= 2) ? arg_array[1] : 0);	// Pitch
	WriteByte((arg_count >= 3) ? arg_array[2] : 0);	// Volume
}